

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::DecodeXMLValue(ON_wString *this)

{
  int iVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ON_wString *in_RSI;
  int local_a0;
  int i;
  int wcount;
  wchar_t w [8];
  wchar_t *buffer2;
  uint u;
  wchar_t c;
  wchar_t *b1;
  wchar_t *b0;
  ON_wString local_40;
  ON_wString s;
  wchar_t *buffer1;
  wchar_t *buffer0_end;
  wchar_t *buffer0;
  int length0;
  ON_wString *this_local;
  
  iVar1 = Length(in_RSI);
  if (iVar1 < 1) {
    ON_wString(this,&EmptyString);
  }
  else {
    pwVar3 = Array(in_RSI);
    if (pwVar3 == (wchar_t *)0x0) {
      ON_wString(this,&EmptyString);
    }
    else {
      pwVar4 = pwVar3 + iVar1;
      for (s.m_s = pwVar3; s.m_s < pwVar4; s.m_s = s.m_s + 1) {
        if ((*s.m_s == L'&') &&
           (pwVar5 = ParseXMLCharacterEncoding
                               (s.m_s,(int)((long)pwVar4 - (long)s.m_s >> 2),0,(uint *)0x0),
           pwVar5 != (wchar_t *)0x0)) {
          Duplicate(&local_40);
          iVar2 = Length(&local_40);
          if (iVar2 != iVar1) {
            ON_wString(this,&EmptyString);
            goto LAB_009986a5;
          }
          b1 = Array(&local_40);
          if (b1 == pwVar3) {
            ON_wString(this,&EmptyString);
            goto LAB_009986a5;
          }
          buffer2._4_4_ = L'\0';
          _u = b1 + ((long)s.m_s - (long)pwVar3 >> 2);
          goto LAB_00998535;
        }
      }
      ON_wString(this,in_RSI);
    }
  }
  return (ON_wString)(wchar_t *)this;
LAB_00998535:
  if (pwVar4 <= s.m_s) {
    SetLength(&local_40,(long)_u - (long)b1 >> 2);
    ON_wString(this,&local_40);
LAB_009986a5:
    b0._0_4_ = 1;
    ~ON_wString(&local_40);
    return (ON_wString)(wchar_t *)this;
  }
  buffer2._4_4_ = *s.m_s;
  if (buffer2._4_4_ == L'&') {
    buffer2._0_4_ = 0x110000;
    pwVar3 = ParseXMLCharacterEncoding
                       (s.m_s,(int)((ulong)((long)pwVar4 - (long)s.m_s) >> 2),0x110000,
                        (uint *)&buffer2);
    if (pwVar3 <= s.m_s) goto LAB_0099864d;
    w[2] = L'\0';
    w[3] = L'\0';
    w[4] = L'\0';
    w[5] = L'\0';
    _i = 0;
    w[0] = L'\0';
    w[1] = L'\0';
    s.m_s = pwVar3;
    iVar1 = ON_EncodeWideChar((ON__UINT32)buffer2,8,&i);
    if (iVar1 < 1) goto LAB_0099864d;
    for (local_a0 = 0; pwVar3 = _u, local_a0 + 1 < iVar1; local_a0 = local_a0 + 1) {
      _u = _u + 1;
      *pwVar3 = (&i)[local_a0];
    }
    buffer2._4_4_ = (&i)[iVar1 + -1];
  }
  else {
LAB_0099864d:
    s.m_s = s.m_s + 1;
  }
  *_u = buffer2._4_4_;
  _u = _u + 1;
  goto LAB_00998535;
}

Assistant:

const ON_wString ON_wString::DecodeXMLValue() const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0_end = buffer0 + length0;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    if (ON_wString::Ampersand != *buffer1)
      continue;
    if (nullptr == ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), 0, nullptr))
      continue;

    // need to copy and modify.
    ON_wString s = this->Duplicate();
    if (s.Length() != length0)
      return ON_wString::EmptyString; // catastrophe!
    wchar_t* b0 = s.Array();
    if ( b0 == buffer0)
      return ON_wString::EmptyString; // catastrophe!

    // skip what we've already parsed
    wchar_t* b1 = b0 + (buffer1 - buffer0);

    // continue parsing and copying parsed results to s.
    for (wchar_t c = 0; buffer1 < buffer0_end; *b1++ = c)
    {
      c = *buffer1;
      if (ON_wString::Ampersand == c)
      {
        unsigned u = ON_UnicodeCodePoint::ON_InvalidCodePoint;
        const wchar_t* buffer2 = ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), u, &u);
        if (buffer2 > buffer1)
        {
          buffer1 = buffer2;
          wchar_t w[8] = {};
          const int wcount = ON_EncodeWideChar(u, sizeof(w) / sizeof(w[0]), w);
          if (wcount >= 1)
          {
            for (int i = 0; i + 1 < wcount; ++i)
              *b1++ = w[i]; // UTF-16 or UTF-8 encoding
            c = w[wcount - 1];
            continue;
          }
        }
      }
      ++buffer1;
    }

    // s is the decoded version of this.
    s.SetLength(b1 - b0);
    return s;
  }

  // nothing to decode
  return *this;
}